

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::EndpointInfo::getMessage(EndpointInfo *this,Time maxTime)

{
  bool bVar1;
  __int_type _Var2;
  int *piVar3;
  pointer this_00;
  long in_RSI;
  Message *in_RDI;
  handle handle;
  type *msg;
  memory_order __b;
  shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int iVar4;
  _Head_base<0UL,_helics::Message_*,_false> this_01;
  lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  local_48;
  TimeRepresentation<count_time<9,_long>_> local_28 [2];
  int local_14;
  memory_order local_10;
  int local_c;
  int *local_8;
  
  piVar3 = (int *)(in_RSI + 0xd0);
  local_c = 5;
  this_01._M_head_impl = in_RDI;
  local_8 = piVar3;
  local_10 = CLI::std::operator&(seq_cst,__memory_order_mask);
  if (local_c - 1U < 2) {
    local_14 = *piVar3;
  }
  else if (local_c == 5) {
    local_14 = *piVar3;
  }
  else {
    local_14 = *piVar3;
  }
  iVar4 = local_c;
  if (0 < local_14) {
    gmlc::libguarded::
    shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
    ::lock(in_stack_ffffffffffffff78);
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
    ::operator->(&local_48);
    bVar1 = std::
            deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
            ::empty((deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                     *)0x4fab37);
    if (bVar1) {
      std::unique_ptr<helics::Message,std::default_delete<helics::Message>>::
      unique_ptr<std::default_delete<helics::Message>,void>
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 CONCAT44(iVar4,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
      bVar1 = true;
    }
    else {
      gmlc::libguarded::
      lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
      ::operator->(&local_48);
      std::
      deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::front((deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
               *)this_01._M_head_impl);
      this_00 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                           0x4fab72);
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<=(&this_00->time,local_28);
      if (bVar1) {
        _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_RDI);
        if (0 < _Var2) {
          std::__atomic_base<int>::operator--((__atomic_base<int> *)(in_RSI + 0xd0));
        }
        gmlc::libguarded::
        lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
        ::operator->(&local_48);
        std::
        deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
        ::front((deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                 *)this_01._M_head_impl);
        CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   CONCAT44(iVar4,in_stack_ffffffffffffff80),
                   (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_ffffffffffffff78);
        gmlc::libguarded::
        lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
        ::operator->(&local_48);
        std::
        deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
        ::pop_front((deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                     *)CONCAT44(iVar4,in_stack_ffffffffffffff80));
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
    ::~lock_handle((lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
                    *)0x4fac14);
    if (bVar1) {
      return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             this_01._M_head_impl;
    }
  }
  std::unique_ptr<helics::Message,std::default_delete<helics::Message>>::
  unique_ptr<std::default_delete<helics::Message>,void>
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
             CONCAT44(iVar4,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)this_01._M_head_impl;
}

Assistant:

std::unique_ptr<Message> EndpointInfo::getMessage(Time maxTime)
{
    if (mAvailableMessages.load() > 0) {
        auto handle = message_queue.lock();
        if (handle->empty()) {
            return nullptr;
        }
        if (handle->front()->time <= maxTime) {
            if (mAvailableMessages > 0) {
                --mAvailableMessages;
            }
            auto msg = std::move(handle->front());
            handle->pop_front();
            return msg;
        }
    }
    return nullptr;
}